

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::iterate(ShaderAtomicCompSwapCase *this)

{
  GLuint program;
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  pointer puVar6;
  TestError *pTVar7;
  deUint32 ndx;
  uint uVar8;
  int iVar9;
  char *description;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  pointer *ppuVar17;
  allocator_type local_369;
  uint local_368;
  int local_364;
  void *local_360;
  Functions *local_358;
  Buffer inoutBuffer;
  InterfaceBlockInfo blockInfo;
  InterfaceVariableInfo groupVarInfo;
  InterfaceVariableInfo outVarInfo;
  InterfaceVariableInfo exhVarInfo;
  InterfaceVariableInfo cmpVarInfo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufData;
  Functions *pFVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar5 = (Functions *)CONCAT44(extraout_var,iVar1);
  program = (this->m_program->m_program).m_program;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&inoutBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  GVar2 = (*pFVar5->getProgramResourceIndex)(program,0x92e6,"InOut");
  glu::getProgramInterfaceBlockInfo(&blockInfo,pFVar5,program,0x92e6,GVar2);
  GVar2 = (*pFVar5->getProgramResourceIndex)(program,0x92e5,"InOut.compareValues[0]");
  glu::getProgramInterfaceVariableInfo(&cmpVarInfo,pFVar5,program,0x92e5,GVar2);
  GVar2 = (*pFVar5->getProgramResourceIndex)(program,0x92e5,"InOut.exchangeValues[0]");
  glu::getProgramInterfaceVariableInfo(&exhVarInfo,pFVar5,program,0x92e5,GVar2);
  GVar2 = (*pFVar5->getProgramResourceIndex)(program,0x92e5,"InOut.outputValues[0]");
  glu::getProgramInterfaceVariableInfo(&outVarInfo,pFVar5,program,0x92e5,GVar2);
  GVar2 = (*pFVar5->getProgramResourceIndex)(program,0x92e5,"InOut.groupValues[0]");
  glu::getProgramInterfaceVariableInfo(&groupVarInfo,pFVar5,program,0x92e5,GVar2);
  dVar3 = (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[2] *
          (this->m_numWorkGroups).m_data[0];
  uVar10 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[2] *
           (this->m_workGroupSize).m_data[0] * dVar3;
  if ((((cmpVarInfo.arraySize != uVar10) || (exhVarInfo.arraySize != uVar10)) ||
      (outVarInfo.arraySize != uVar10)) || (groupVarInfo.arraySize != dVar3)) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,
               "cmpVarInfo.arraySize == numValues && exhVarInfo.arraySize == numValues && outVarInfo.arraySize == numValues && groupVarInfo.arraySize == product(m_numWorkGroups)"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
               ,0x3f4);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pFVar5->useProgram)(program);
  uVar12 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[2] *
           (this->m_workGroupSize).m_data[0];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&bufData,(ulong)blockInfo.dataSize,&local_369);
  for (puVar6 = bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 != bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    *puVar6 = '\0';
  }
  for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    *(uint *)(bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start +
             (ulong)(cmpVarInfo.arrayStride * uVar8) + (ulong)cmpVarInfo.offset) = uVar8 % uVar12;
  }
  for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    *(uint *)(bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start +
             (ulong)(exhVarInfo.arrayStride * uVar8) + (ulong)exhVarInfo.offset) =
         uVar8 % uVar12 + 1;
  }
  (*pFVar5->bindBuffer)(0x90d2,inoutBuffer.super_ObjectWrapper.m_object);
  (*pFVar5->bufferData)
            (0x90d2,(ulong)blockInfo.dataSize,
             bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e5);
  (*pFVar5->bindBufferBase)(0x90d2,0,inoutBuffer.super_ObjectWrapper.m_object);
  GVar4 = (*pFVar5->getError)();
  glu::checkError(GVar4,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0x40a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  (*pFVar5->dispatchCompute)
            ((this->m_numWorkGroups).m_data[0],(this->m_numWorkGroups).m_data[1],
             (this->m_numWorkGroups).m_data[2]);
  local_360 = (*pFVar5->mapBufferRange)(0x90d2,0,(ulong)blockInfo.dataSize,1);
  iVar1 = (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[2] *
          (this->m_numWorkGroups).m_data[0];
  uVar10 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[2] *
           (this->m_workGroupSize).m_data[0];
  GVar4 = (*pFVar5->getError)();
  glu::checkError(GVar4,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0x416);
  local_358 = pFVar5;
  if (local_360 == (void *)0x0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,"resPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
               ,0x417);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar14 = 0;
  uVar15 = 0;
  if (0 < (int)uVar10) {
    uVar15 = (ulong)uVar10;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  bVar11 = true;
  iVar16 = 0;
  do {
    uVar13 = 0xffffffffffffffff;
    ppuVar17 = &bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (iVar16 == iVar1) {
LAB_01245940:
      pFVar5 = local_358;
      (*local_358->unmapBuffer)(0x90d2);
      GVar4 = (*pFVar5->getError)();
      glu::checkError(GVar4,"glUnmapBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                      ,0x436);
      description = "Comparison failed";
      if (bVar11) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar11 & QP_TEST_RESULT_FAIL,description);
      std::__cxx11::string::~string((string *)&groupVarInfo);
      std::__cxx11::string::~string((string *)&outVarInfo);
      std::__cxx11::string::~string((string *)&exhVarInfo);
      std::__cxx11::string::~string((string *)&cmpVarInfo);
      glu::InterfaceBlockInfo::~InterfaceBlockInfo(&blockInfo);
      glu::ObjectWrapper::~ObjectWrapper(&inoutBuffer.super_ObjectWrapper);
      return STOP;
    }
    local_368 = *(uint *)((long)local_360 +
                         (long)(groupVarInfo.arrayStride * iVar16) + (ulong)groupVarInfo.offset);
    iVar9 = outVarInfo.arrayStride * iVar14;
    do {
      if (uVar13 - uVar15 == -1) goto LAB_0124588f;
      uVar12 = *(uint *)((long)local_360 + (long)iVar9 + (ulong)outVarInfo.offset);
      uVar13 = uVar13 + 1;
      iVar9 = iVar9 + outVarInfo.arrayStride;
    } while (uVar13 == uVar12);
    bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_364 = iVar14;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar17);
    std::operator<<((ostream *)ppuVar17,"ERROR: at group ");
    std::ostream::operator<<(ppuVar17,iVar16);
    std::operator<<((ostream *)ppuVar17,", invocation ");
    std::ostream::operator<<(ppuVar17,(int)uVar13);
    std::operator<<((ostream *)ppuVar17,": expected ");
    std::ostream::operator<<(ppuVar17,(int)uVar13);
    std::operator<<((ostream *)ppuVar17,", got ");
    std::ostream::operator<<(ppuVar17,uVar12);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&bufData,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar17);
    bVar11 = false;
    iVar14 = local_364;
LAB_0124588f:
    if (local_368 != uVar10) {
      bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppuVar17 = &bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar17);
      std::operator<<((ostream *)ppuVar17,"ERROR: at group ");
      uVar12 = local_368;
      std::ostream::operator<<(ppuVar17,iVar16);
      std::operator<<((ostream *)ppuVar17,": expected");
      std::ostream::operator<<(ppuVar17,uVar10);
      std::operator<<((ostream *)ppuVar17,", got ");
      std::ostream::operator<<(ppuVar17,uVar12);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&bufData,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar17);
      bVar11 = false;
      goto LAB_01245940;
    }
    iVar16 = iVar16 + 1;
    iVar14 = iVar14 + uVar10;
  } while( true );
}

Assistant:

ShaderAtomicOpCase::IterateResult ShaderAtomicCompSwapCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	const Buffer				inoutBuffer		(m_context.getRenderContext());
	const deUint32				blockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "InOut");
	const InterfaceBlockInfo	blockInfo		= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, blockNdx);
	const deUint32				cmpVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.compareValues[0]");
	const InterfaceVariableInfo	cmpVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, cmpVarNdx);
	const deUint32				exhVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.exchangeValues[0]");
	const InterfaceVariableInfo	exhVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, exhVarNdx);
	const deUint32				outVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.outputValues[0]");
	const InterfaceVariableInfo	outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarNdx);
	const deUint32				groupVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.groupValues[0]");
	const InterfaceVariableInfo	groupVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, groupVarNdx);
	const deUint32				numValues		= product(m_workGroupSize)*product(m_numWorkGroups);

	TCU_CHECK(cmpVarInfo.arraySize == numValues &&
			  exhVarInfo.arraySize == numValues &&
			  outVarInfo.arraySize == numValues &&
			  groupVarInfo.arraySize == product(m_numWorkGroups));

	gl.useProgram(program);

	// \todo [2013-09-05 pyry] Use randomized input values!

	// Setup buffer.
	{
		const deUint32	workGroupSize	= product(m_workGroupSize);
		vector<deUint8>	bufData			(blockInfo.dataSize);

		std::fill(bufData.begin(), bufData.end(), 0);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + cmpVarInfo.offset + cmpVarInfo.arrayStride*ndx) = ndx%workGroupSize;

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + exhVarInfo.offset + exhVarInfo.arrayStride*ndx) = (ndx%workGroupSize)+1;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inoutBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, &bufData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *inoutBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());

	// Read back and compare
	{
		const void*		resPtr			= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, blockInfo.dataSize, GL_MAP_READ_BIT);
		const int		numWorkGroups	= (int)product(m_numWorkGroups);
		const int		workGroupSize	= (int)product(m_workGroupSize);
		bool			isOk			= true;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)resPtr + groupVarInfo.offset + groupNdx*groupVarInfo.arrayStride);

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	refValue		= localNdx;
				const int	outputValue		= *(const deInt32*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*(groupOffset+localNdx));

				if (outputValue != refValue)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected " << refValue << ", got " << outputValue
									   << TestLog::EndMessage;
					isOk = false;
					break;
				}
			}

			if (groupOutput != workGroupSize)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected" << workGroupSize << ", got " << groupOutput << TestLog::EndMessage;
				isOk = false;
				break;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Comparison failed");
	}

	return STOP;
}